

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O2

size_t __thiscall
Assimp::ObjFileParser::getTexCoordVector
          (ObjFileParser *this,
          vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *point3d_array)

{
  char *pcVar1;
  size_t sVar2;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var3;
  DeadlyImportError *this_00;
  allocator local_51;
  ai_real local_50;
  ai_real local_4c;
  undefined1 local_48 [8];
  ai_real local_40;
  
  sVar2 = getNumComponentsInDataDefinition(this);
  if (sVar2 == 3) {
    pcVar1 = this->m_buffer;
    copyNextWord(this,pcVar1,0x1000);
    local_50 = fast_atof(pcVar1);
    copyNextWord(this,pcVar1,0x1000);
    local_4c = fast_atof(pcVar1);
    copyNextWord(this,pcVar1,0x1000);
    local_40 = fast_atof(pcVar1);
    local_48._4_4_ = local_4c;
  }
  else {
    if (sVar2 != 2) {
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)local_48,"OBJ: Invalid number of components",&local_51)
      ;
      DeadlyImportError::DeadlyImportError(this_00,(string *)local_48);
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar1 = this->m_buffer;
    copyNextWord(this,pcVar1,0x1000);
    local_50 = fast_atof(pcVar1);
    copyNextWord(this,pcVar1,0x1000);
    local_48._4_4_ = fast_atof(pcVar1);
    local_40 = 0.0;
  }
  local_48._0_4_ = local_50;
  if (0x7f7fffff < (uint)ABS(local_50)) {
    local_48._0_4_ = 0.0;
  }
  if (0x7f7fffff < (uint)ABS((float)local_48._4_4_)) {
    local_48._4_4_ = 0.0;
  }
  if (0x7f7fffff < (uint)ABS(local_40)) {
    local_40 = 0.0;
  }
  std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::emplace_back<aiVector3t<float>>
            ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)point3d_array,
             (aiVector3t<float> *)local_48);
  _Var3 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine);
  (this->m_DataIt)._M_current = _Var3._M_current;
  return sVar2;
}

Assistant:

size_t ObjFileParser::getTexCoordVector( std::vector<aiVector3D> &point3d_array ) {
    size_t numComponents = getNumComponentsInDataDefinition();
    ai_real x, y, z;
    if( 2 == numComponents ) {
        copyNextWord( m_buffer, Buffersize );
        x = ( ai_real ) fast_atof( m_buffer );

        copyNextWord( m_buffer, Buffersize );
        y = ( ai_real ) fast_atof( m_buffer );
        z = 0.0;
    } else if( 3 == numComponents ) {
        copyNextWord( m_buffer, Buffersize );
        x = ( ai_real ) fast_atof( m_buffer );

        copyNextWord( m_buffer, Buffersize );
        y = ( ai_real ) fast_atof( m_buffer );

        copyNextWord( m_buffer, Buffersize );
        z = ( ai_real ) fast_atof( m_buffer );
    } else {
        throw DeadlyImportError( "OBJ: Invalid number of components" );
    }

    // Coerce nan and inf to 0 as is the OBJ default value
    if (!std::isfinite(x))
        x = 0;

    if (!std::isfinite(y))
        y = 0;

    if (!std::isfinite(z))
        z = 0;

    point3d_array.push_back( aiVector3D( x, y, z ) );
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
    return numComponents;
}